

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O1

void anon_unknown.dwarf_24ed2e::runtests(bool nonfatal,bool tiny)

{
  int banks;
  long lVar1;
  long lVar2;
  char **channels;
  char **passivechannels;
  long *plVar3;
  PixelType *pt;
  char **channels_00;
  PixelType *pt_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  size_t sVar9;
  Box2i *pBVar10;
  Compression *pCVar11;
  _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
  *this;
  Header *pHVar12;
  undefined1 nonfatal_00;
  char **passivechannels_00;
  undefined1 *puVar13;
  char *pcVar14;
  long lVar15;
  allocator<char> local_339;
  undefined1 local_338 [32];
  _Base_ptr p_Stack_318;
  size_t local_310;
  InputFile infile;
  long local_2f0;
  FrameBuffer readFrameBuf;
  FrameBuffer preReadFrameBuf;
  undefined1 *local_280;
  char *local_278;
  FrameBuffer writeFrameBuf;
  Box2i local_1f8;
  Header hdr;
  ostringstream q;
  ios_base local_138 [264];
  
  random_reseed(1);
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  local_2f0 = 0;
  local_278 = "RGBHalf";
  local_280 = (anonymous_namespace)::Schemes;
  do {
    lVar15 = 0;
    pcVar14 = "RGBHalf";
    puVar13 = (anonymous_namespace)::Schemes;
    do {
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x80;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 2;
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_2f0);
      q = (ostringstream)0x2c;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&q,1);
      lVar1 = *(long *)poVar8;
      lVar2 = *(long *)(lVar1 + -0x18);
      *(uint *)(poVar8 + lVar2 + 0x18) = *(uint *)(poVar8 + lVar2 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar8 + *(long *)(lVar1 + -0x18) + 0x10) = 2;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar15);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,": ",2);
      std::ostream::flush();
      channels = *(char ***)(local_280 + 8);
      passivechannels = *(char ***)(local_280 + 0x10);
      iVar7 = *(int *)(local_280 + 0x18);
      plVar3 = *(long **)(local_280 + 0x20);
      pt = *(PixelType **)(local_280 + 0x28);
      channels_00 = *(char ***)(puVar13 + 8);
      passivechannels_00 = *(char ***)(puVar13 + 0x10);
      banks = *(int *)(puVar13 + 0x18);
      pt_00 = *(PixelType **)(puVar13 + 0x28);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&q);
      sVar9 = strlen(local_278);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,local_278,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q," read as ",9);
      sVar9 = strlen(pcVar14);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,pcVar14,sVar9);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&q,"...",3);
      lVar1 = std::cout;
      *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) =
           *(uint *)(std::__cxx11::string::find + *(long *)(std::cout + -0x18)) & 0xffffff4f | 0x20;
      *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 0x35;
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,(char *)hdr._map._M_t._M_impl._0_8_,
                 hdr._map._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
      if ((_Base_ptr *)hdr._map._M_t._M_impl._0_8_ !=
          &hdr._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)hdr._map._M_t._M_impl._0_8_,
                        (ulong)((long)&(hdr._map._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_parent)->_M_color + 1));
      }
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl._0_8_ = 0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_2_5::Header::Header
                (&hdr,0x80,0x80,1.0,(V2f *)&readFrameBuf,1.0,INCREASING_Y,ZIP_COMPRESSION);
      iVar5 = random_int(0xc9);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar10->min).x = iVar5 + -100;
      iVar5 = random_int(0xc9);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      (pBVar10->min).y = iVar5 + -100;
      if (nonfatal) {
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = (pBVar10->min).x;
        iVar6 = random_int(0xe);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar10->max).x = iVar6 + iVar5 + 1;
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = (pBVar10->min).y;
        iVar6 = random_int(0xe);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = iVar6 + iVar5 + 1;
      }
      else {
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = (pBVar10->min).x;
        iVar6 = random_int(400);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        (pBVar10->max).x = iVar6 + iVar5 + 0x40;
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = (pBVar10->min).y;
        iVar6 = random_int(400);
        pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
        iVar5 = iVar6 + iVar5 + 0x40;
      }
      (pBVar10->max).y = iVar5;
      pCVar11 = Imf_2_5::Header::compression(&hdr);
      *pCVar11 = ZIPS_COMPRESSION;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setupBuffer((ChannelList *)local_338,&hdr,channels,passivechannels,pt,&writeFrameBuf,
                  &readFrameBuf,&preReadFrameBuf,iVar7,true);
      this = (_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
              *)Imf_2_5::Header::channels(&hdr);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::clear(this);
      if ((_Base_ptr)local_338._16_8_ != (_Base_ptr)0x0) {
        (this->_M_impl).super__Rb_tree_header._M_header._M_color = local_338._8_4_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_parent = (_Base_ptr)local_338._16_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_left = (_Base_ptr)local_338._24_8_;
        (this->_M_impl).super__Rb_tree_header._M_header._M_right = p_Stack_318;
        *(_Rb_tree_header **)(local_338._16_8_ + 8) = &(this->_M_impl).super__Rb_tree_header;
        (this->_M_impl).super__Rb_tree_header._M_node_count = local_310;
        local_338._16_8_ = (_Base_ptr)0x0;
        local_338._24_8_ = local_338 + 8;
        local_310 = 0;
        p_Stack_318 = (_Base_ptr)local_338._24_8_;
      }
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)local_338);
      if (plVar3 != (long *)0x0) {
        infile.super_GenericInputFile._vptr_GenericInputFile = (_func_int **)0x0;
        infile._data = (Data *)0x0;
        lVar1 = *plVar3;
        while (lVar1 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_338,(char *)*plVar3,&local_339);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infile,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338)
          ;
          if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
            operator_delete((void *)local_338._0_8_,(ulong)(local_338._16_8_ + 1));
          }
          lVar1 = plVar3[1];
          plVar3 = plVar3 + 1;
        }
        Imf_2_5::addMultiView(&hdr,(StringVector *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&infile);
      }
      remove((anonymous_namespace)::filename_abi_cxx11_);
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::OutputFile::OutputFile((OutputFile *)local_338,pcVar14,&hdr,iVar7);
      Imf_2_5::OutputFile::setFrameBuffer((OutputFile *)local_338,&writeFrameBuf);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      iVar7 = (pBVar10->max).y;
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      Imf_2_5::OutputFile::writePixels((OutputFile *)local_338,(iVar7 - (pBVar10->min).y) + 1);
      pBVar10 = Imf_2_5::Header::dataWindow(&hdr);
      local_1f8.min = pBVar10->min;
      local_1f8.max = pBVar10->max;
      Imf_2_5::OutputFile::~OutputFile((OutputFile *)local_338);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      Imf_2_5::Header::~Header(&hdr);
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_338._8_4_ = _S_red;
      local_338._16_8_ = (_Base_ptr)0x0;
      local_338._24_8_ = local_338 + 8;
      local_310 = 0;
      p_Stack_318 = (_Base_ptr)local_338._24_8_;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      std::ostream::flush();
      pcVar14 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar7 = Imf_2_5::globalThreadCount();
      Imf_2_5::InputFile::InputFile(&infile,pcVar14,iVar7);
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      setupBuffer((ChannelList *)&hdr,pHVar12,channels_00,passivechannels_00,pt_00,&readFrameBuf,
                  &preReadFrameBuf,(FrameBuffer *)local_338,banks,false);
      nonfatal_00 = SUB81(passivechannels_00,0);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                   *)&hdr);
      Imf_2_5::InputFile::setFrameBuffer(&infile,&readFrameBuf);
      std::ostream::flush();
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      pBVar10 = Imf_2_5::Header::dataWindow(pHVar12);
      iVar7 = (pBVar10->min).y;
      pHVar12 = Imf_2_5::InputFile::header(&infile);
      pBVar10 = Imf_2_5::Header::dataWindow(pHVar12);
      Imf_2_5::InputFile::readPixels(&infile,iVar7,(pBVar10->max).y);
      bVar4 = Imf_2_5::InputFile::isOptimizationEnabled(&infile);
      Imf_2_5::InputFile::~InputFile(&infile);
      compare(&readFrameBuf,&writeFrameBuf,&local_1f8,(bool)nonfatal_00);
      compare(&preReadFrameBuf,(FrameBuffer *)local_338,&local_1f8,(bool)nonfatal_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," OK ",4);
      if (bVar4) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OPTIMISED ",10);
        (anonymous_namespace)::gOptimisedReads = (anonymous_namespace)::gOptimisedReads + 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      (anonymous_namespace)::gSuccesses = (anonymous_namespace)::gSuccesses + 1;
      remove((anonymous_namespace)::filename_abi_cxx11_);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)local_338);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&readFrameBuf);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&writeFrameBuf);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&q);
      std::ios_base::~ios_base(local_138);
      lVar15 = lVar15 + 1;
      puVar13 = (anonymous_namespace)::Schemes + lVar15 * 0x30;
      pcVar14 = *(char **)((anonymous_namespace)::Schemes + lVar15 * 0x30);
    } while (lVar15 != 0x23);
    local_2f0 = local_2f0 + 1;
    local_280 = (anonymous_namespace)::Schemes + local_2f0 * 0x30;
    local_278 = *(char **)((anonymous_namespace)::Schemes + local_2f0 * 0x30);
  } while (local_2f0 != 0x23);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0);
  q = (ostringstream)0x2f;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&q,1);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," runs failed\n",0xd);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8," tests skipped (assumed to be bad)\n",0x23);
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  q = (ostringstream)0x2f;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&q,1);
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(anonymous_namespace)::gSuccesses);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8," optimised\n",0xb);
  return;
}

Assistant:

void runtests(bool nonfatal,bool tiny)
{
    random_reseed(1);
    int i=0;
    int skipped=0;
    
    gFailures=0;
    gSuccesses=0;
    gOptimisedReads=0;
    
    
    while(Schemes[i]._name!=NULL)
    {
        int j=0;
        while(Schemes[j]._name!=NULL)
        {
           cout << right << setw(2) << i << ',' << right << setw(2) << j << ": ";
           cout.flush();

           if (nonfatal)
           {
               cout << " skipping " << Schemes[i]._name << ',' << Schemes[j]._name << ": known to crash\n";
               skipped++;
           }
           else
           {
               test(Schemes[i],Schemes[j],nonfatal,tiny);
           }
           j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses+gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";
        
    if (gFailures>0 )
    {
        cout << " TESTS FAILED\n";
        assert(false);
    }
}